

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

int __thiscall smf::MidiEventList::append(MidiEventList *this,MidiEvent *event)

{
  iterator __position;
  MidiEvent *this_00;
  pointer ppMVar1;
  MidiEvent *ptr;
  MidiEvent *local_20;
  
  this_00 = (MidiEvent *)operator_new(0x38);
  MidiEvent::MidiEvent(this_00,event);
  __position._M_current =
       (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_20 = this_00;
    std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
    _M_realloc_insert<smf::MidiEvent*const&>
              ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)this,__position,&local_20)
    ;
    ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = this_00;
    ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppMVar1;
  }
  return (int)((ulong)((long)ppMVar1 -
                      (long)(this->list).
                            super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int MidiEventList::append(MidiEvent& event) {
	MidiEvent* ptr = new MidiEvent(event);
	list.push_back(ptr);
	return (int)list.size()-1;
}